

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  value_type_conflict *lhs;
  undefined1 uVar1;
  storage __tmp;
  bool bVar2;
  bool *pbVar3;
  storage_type sVar4;
  value_type_conflict *lhs_00;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  storage_type local_5a;
  storage_type local_59;
  AssertHelper local_58;
  Message local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  AssertHelper local_20;
  
  local_5a = (storage_type)
             (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
  local_59 = (storage_type)
             (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
  local_40._M_dataplus._M_p._0_1_ = 1;
  local_40._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._M_dataplus._M_p._0_1_ = '\x01';
  local_40._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_59.value != true) {
    lhs = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_40,"this->value_2","*o1",lhs,&local_59.value);
    if ((char)local_40._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_50);
      if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_40._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x356,pcVar5);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pbVar3 = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                       ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_59);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_40,"this->value_2","o1.value()",lhs,pbVar3);
    if ((char)local_40._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_50);
      if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_40._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x357,pcVar5);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lhs_00 = &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
    sVar4 = local_59;
    if (local_59.value == true) {
      uVar1 = (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_1;
      sVar4 = (storage_type)uVar1;
    }
    local_50.ss_.ptr_._0_1_ = (internal)(sVar4.null_value & 1);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_40,"this->value_2","o1.value_or(this->value_1)",lhs,
               (bool *)&local_50);
    if ((char)local_40._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_50);
      if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)local_40._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x358,pcVar5);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ss_.ptr_._0_1_ = (internal)(local_5a.value != true);
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_5a.value == true) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&local_50,(AssertionResult *)0x1b9f12,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x359,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                         (char)local_40._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p),
                        local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_58.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_58.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_58.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_50.ss_.ptr_._0_1_ = (internal)(local_5a.value != true);
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_5a.value == true) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_40,(internal *)&local_50,(AssertionResult *)"o2.has_value()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_20,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                 ,0x35a,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                         (char)local_40._M_dataplus._M_p));
      testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p) !=
          &local_40.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_40._M_dataplus._M_p._1_7_,(char)local_40._M_dataplus._M_p),
                        local_40.field_2._M_allocated_capacity + 1);
      }
      if (local_58.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_58.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_58.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_5a.value != true) {
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&local_40,"this->value_1","*o2",lhs_00,&local_5a.value);
      if ((char)local_40._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_50);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x35b,pcVar5);
        testing::internal::AssertHelper::operator=(&local_58,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pbVar3 = mp::opt<bool,_mp::opt_default_policy<bool>_>::value
                         ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_5a);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&local_40,"this->value_1","o2.value()",lhs_00,pbVar3);
      if ((char)local_40._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_50);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x35c,pcVar5);
        testing::internal::AssertHelper::operator=(&local_58,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      sVar4.value = *lhs;
      if (local_5a.value != true) {
        sVar4 = local_5a;
      }
      local_50.ss_.ptr_._0_1_ = (internal)(sVar4.null_value & 1);
      testing::internal::CmpHelperEQ<bool,bool>
                ((internal *)&local_40,"this->value_1","o2.value_or(this->value_2)",lhs_00,
                 (bool *)&local_50);
      if ((char)local_40._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_50);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp"
                   ,0x35d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_58,&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             ((long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(local_50.ss_.ptr_._1_7_,local_50.ss_.ptr_._0_1_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_40._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
  }
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/include/opt.h",
                0xdf,
                "T &mp::opt<bool>::operator*() & [T = bool, Policy = mp::opt_default_policy<bool>]")
  ;
}

Assistant:

TYPED_TEST(optTyped, swapNotEmptyWithNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2{this->value_2};
  std::swap(o1, o2);
  EXPECT_TRUE(o1);
  EXPECT_TRUE(o1.has_value());
  EXPECT_EQ(this->value_2, *o1);
  EXPECT_EQ(this->value_2, o1.value());
  EXPECT_EQ(this->value_2, o1.value_or(this->value_1));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}